

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * adios2sys::SystemTools::GetFilenameLastExtension(string *filename)

{
  long lVar1;
  string *in_RDI;
  size_type dot_pos;
  string name;
  allocator local_49;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  string local_30 [48];
  
  GetFilenameName((string *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  lVar1 = std::__cxx11::string::rfind((char)local_30,0x2e);
  if (lVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  else {
    std::__cxx11::string::erase((ulong)local_30,0);
    std::__cxx11::string::string((string *)in_RDI,local_30);
  }
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string SystemTools::GetFilenameLastExtension(const std::string& filename)
{
  std::string name = SystemTools::GetFilenameName(filename);
  std::string::size_type dot_pos = name.rfind('.');
  if (dot_pos != std::string::npos) {
    name.erase(0, dot_pos);
    return name;
  } else {
    return "";
  }
}